

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  EnumDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar2;
  Descriptor *descriptor_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  int i;
  int iVar3;
  
  DescriptorBuilder::ValidateOptions(*(DescriptorBuilder **)this,descriptor,proto);
  for (iVar3 = 0; iVar3 < descriptor->enum_type_count_; iVar3 = iVar3 + 1) {
    descriptor_00 = Descriptor::enum_type(descriptor,iVar3);
    proto_00 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar3);
    Visit<google::protobuf::EnumDescriptorProto_const>(this,descriptor_00,proto_00);
  }
  for (iVar3 = 0; iVar3 < descriptor->oneof_decl_count_; iVar3 = iVar3 + 1) {
    Descriptor::oneof_decl(descriptor,iVar3);
    RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
              (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar3);
  }
  for (iVar3 = 0; iVar3 < descriptor->field_count_; iVar3 = iVar3 + 1) {
    pFVar1 = Descriptor::field(descriptor,iVar3);
    pVVar2 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar3);
    Visit<google::protobuf::FieldDescriptorProto_const>(this,pFVar1,pVVar2);
  }
  for (iVar3 = 0; iVar3 < descriptor->nested_type_count_; iVar3 = iVar3 + 1) {
    descriptor_01 = Descriptor::nested_type(descriptor,iVar3);
    proto_01 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar3);
    Visit<google::protobuf::DescriptorProto_const>(this,descriptor_01,proto_01);
  }
  for (iVar3 = 0; iVar3 < descriptor->extension_count_; iVar3 = iVar3 + 1) {
    pFVar1 = Descriptor::extension(descriptor,iVar3);
    pVVar2 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar3);
    Visit<google::protobuf::FieldDescriptorProto_const>(this,pFVar1,pVVar2);
  }
  for (iVar3 = 0; iVar3 < descriptor->extension_range_count_; iVar3 = iVar3 + 1) {
    Descriptor::extension_range(descriptor,iVar3);
    RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
              (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar3);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }